

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

void __thiscall
phosg::StringReader::StringReader
          (StringReader *this,
          shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *data,size_t offset)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  
  this->_vptr_StringReader = (_func_int **)&PTR__StringReader_0012ac80;
  (this->owned_data).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (data->
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  p_Var1 = (data->
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->owned_data).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
    }
  }
  peVar2 = (data->
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  this->data = (uint8_t *)(peVar2->_M_dataplus)._M_p;
  this->length = peVar2->_M_string_length;
  this->offset = offset;
  return;
}

Assistant:

StringReader::StringReader(shared_ptr<string> data, size_t offset)
    : owned_data(data),
      data(reinterpret_cast<const uint8_t*>(data->data())),
      length(data->size()),
      offset(offset) {}